

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O0

JL_STATUS UnmarshalObject(JlDataObject *Object,JlMarshallElement *Description,
                         _Bool IgnoreExistingValuesInStruct,void *Output,size_t *pErrorAtPos)

{
  size_t sVar1;
  JL_STATUS local_34;
  JL_STATUS jlStatus;
  size_t *pErrorAtPos_local;
  void *Output_local;
  _Bool IgnoreExistingValuesInStruct_local;
  JlMarshallElement *Description_local;
  JlDataObject *Object_local;
  
  if ((Description->Type == JL_DATA_TYPE_STRING) && (Description->FieldSize == 0)) {
    local_34 = UnmarshalString(Object,IgnoreExistingValuesInStruct,Output);
  }
  else if ((Description->Type == JL_DATA_TYPE_STRING) && (Description->FieldSize != 0)) {
    local_34 = UnmarshalStringFixed(Object,Output,Description->FieldSize);
  }
  else if ((Description->Type == JL_DATA_TYPE_NUMBER) &&
          (Description->NumberType == JL_NUM_TYPE_UNSIGNED)) {
    local_34 = UnmarshalUnsigned(Object,Output,Description->FieldSize);
  }
  else if ((Description->Type == JL_DATA_TYPE_NUMBER) &&
          (Description->NumberType == JL_NUM_TYPE_SIGNED)) {
    local_34 = UnmarshalSigned(Object,Output,Description->FieldSize);
  }
  else if ((Description->Type == JL_DATA_TYPE_NUMBER) &&
          (Description->NumberType == JL_NUM_TYPE_FLOAT)) {
    local_34 = UnmarshalFloat(Object,Output,Description->FieldSize);
  }
  else if (Description->Type == JL_DATA_TYPE_BOOL) {
    local_34 = UnmarshalBool(Object,Output,Description->FieldSize);
  }
  else if (Description->Type == JL_DATA_TYPE_DICTIONARY) {
    local_34 = UnmarshallDictionary
                         (Object,Description->ChildStructDescription,
                          (ulong)Description->ChildStructDescriptionCount,
                          IgnoreExistingValuesInStruct,Output,pErrorAtPos);
  }
  else {
    local_34 = JL_STATUS_INVALID_TYPE;
  }
  if (((local_34 != JL_STATUS_SUCCESS) && (Description->Type != JL_DATA_TYPE_DICTIONARY)) &&
     (pErrorAtPos != (size_t *)0x0)) {
    sVar1 = JlGetObjectTag(Object);
    *pErrorAtPos = sVar1;
  }
  return local_34;
}

Assistant:

static
JL_STATUS
    UnmarshalObject
    (
        JlDataObject const*         Object,
        JlMarshallElement const*    Description,
        bool                        IgnoreExistingValuesInStruct,
        void*                       Output,
        size_t*                     pErrorAtPos
    )
{
    JL_STATUS jlStatus;

    if( JL_DATA_TYPE_STRING == Description->Type  &&  0 == Description->FieldSize )
    {
        // Regular allocated string.
        // Output is a pointer to a string.
        jlStatus = UnmarshalString( Object, IgnoreExistingValuesInStruct, Output );
    }
    else if( JL_DATA_TYPE_STRING == Description->Type  &&  Description->FieldSize > 0 )
    {
        // Special case: This is a fixed size string in a structure
        jlStatus = UnmarshalStringFixed( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type  &&  JL_NUM_TYPE_UNSIGNED == Description->NumberType )
    {
        jlStatus = UnmarshalUnsigned( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type  &&  JL_NUM_TYPE_SIGNED == Description->NumberType )
    {
        jlStatus = UnmarshalSigned( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type  &&  JL_NUM_TYPE_FLOAT == Description->NumberType )
    {
        jlStatus = UnmarshalFloat( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_BOOL == Description->Type )
    {
        jlStatus = UnmarshalBool( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_DICTIONARY == Description->Type )
    {
        jlStatus = UnmarshallDictionary(
            Object,
            Description->ChildStructDescription, Description->ChildStructDescriptionCount,
            IgnoreExistingValuesInStruct,
            Output,
            pErrorAtPos );
    }
    else
    {
        // Unknown data type
        jlStatus = JL_STATUS_INVALID_TYPE;
    }

    if(     JL_STATUS_SUCCESS != jlStatus
        &&  JL_DATA_TYPE_DICTIONARY != Description->Type
        &&  NULL != pErrorAtPos )
    {
        *pErrorAtPos = JlGetObjectTag( Object );
    }

    return jlStatus;
}